

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

int SaveBinary3dos(path *fname,aint start,aint length,byte type,word w2,word w3)

{
  int iVar1;
  char *badValueMessage;
  size_t sVar2;
  int local_124;
  int result;
  byte v;
  byte *__end1;
  byte *__begin1;
  byte (*__range1) [128];
  byte p3dos_header [128];
  byte local_5d;
  byte sum;
  aint full_length;
  aint hsize;
  string local_48;
  FILE *local_28;
  FILE *ff;
  aint aStack_18;
  word w3_local;
  word w2_local;
  byte type_local;
  aint length_local;
  aint start_local;
  path *fname_local;
  
  ff._2_2_ = w3;
  ff._4_2_ = w2;
  ff._7_1_ = type;
  aStack_18 = length;
  _w2_local = start;
  _length_local = fname;
  local_28 = (FILE *)SJ_fopen(fname,"wb");
  if (local_28 == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_48,_length_local);
    badValueMessage = (char *)std::__cxx11::string::c_str();
    Error("opening file for write",badValueMessage,FATAL);
    std::__cxx11::string::~string((string *)&local_48);
  }
  iVar1 = aStack_18 + 0x80;
  local_5d = '\0';
  memcpy(&__range1,&DAT_001ad790,0x80);
  p3dos_header[3] = (byte)iVar1;
  p3dos_header[4] = (byte)((uint)iVar1 >> 8);
  p3dos_header[5] = (byte)((uint)iVar1 >> 0x10);
  p3dos_header[6] = (byte)((uint)iVar1 >> 0x18);
  p3dos_header[7] = ff._7_1_;
  p3dos_header[8] = (byte)aStack_18;
  p3dos_header[9] = (byte)((uint)aStack_18 >> 8);
  p3dos_header[10] = (byte)ff._4_2_;
  p3dos_header[0xb] = (byte)(ff._4_2_ >> 8);
  p3dos_header[0xc] = (byte)ff._2_2_;
  p3dos_header[0xd] = (byte)(ff._2_2_ >> 8);
  for (__end1 = (byte *)&__range1; __end1 != p3dos_header + 0x78; __end1 = __end1 + 1) {
    local_5d = local_5d + *__end1;
  }
  p3dos_header[0x77] = local_5d;
  sVar2 = fwrite(&__range1,1,0x80,local_28);
  if ((int)sVar2 == 0x80) {
    local_124 = SaveRAM((FILE *)local_28,_w2_local,aStack_18);
  }
  else {
    local_124 = 0;
  }
  fclose(local_28);
  return local_124;
}

Assistant:

int SaveBinary3dos(const std::filesystem::path & fname, aint start, aint length, byte type, word w2, word w3) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) Error("opening file for write", fname.string().c_str(), FATAL);
	// prepare +3DOS 128 byte header content
	constexpr aint hsize = 128;
	const aint full_length = hsize + length;
	byte sum = 0, p3dos_header[hsize] { "PLUS3DOS\032\001" };
	p3dos_header[11] = byte(full_length>>0);
	p3dos_header[12] = byte(full_length>>8);
	p3dos_header[13] = byte(full_length>>16);
	p3dos_header[14] = byte(full_length>>24);
	// +3 BASIC 8 byte header filled with "relevant values"
	p3dos_header[15+0] = type;
	p3dos_header[15+1] = byte(length>>0);
	p3dos_header[15+2] = byte(length>>8);
	p3dos_header[15+3] = byte(w2>>0);
	p3dos_header[15+4] = byte(w2>>8);
	p3dos_header[15+5] = byte(w3>>0);
	p3dos_header[15+6] = byte(w3>>8);
	// calculat checksum of the header
	for (const byte v : p3dos_header) sum += v;
	p3dos_header[hsize-1] = sum;
	// write header and data
	int result = (hsize == (aint) fwrite(p3dos_header, 1, hsize, ff)) ? SaveRAM(ff, start, length) : 0;
	fclose(ff);
	return result;
}